

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleDirectoryMode(cmSetPropertyCommand *this)

{
  undefined8 this_00;
  bool bVar1;
  size_type sVar2;
  reference pbVar3;
  char *pcVar4;
  cmGlobalGenerator *this_01;
  char *local_198;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  char *local_e0;
  char *value;
  char *name;
  string local_c8;
  string local_a8;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_78 [8];
  string dir;
  cmMakefile *mf;
  allocator local_39;
  string local_38;
  cmSetPropertyCommand *local_18;
  cmSetPropertyCommand *this_local;
  
  local_18 = this;
  sVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Names);
  if (sVar2 < 2) {
    dir.field_2._8_8_ = (this->super_cmCommand).Makefile;
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->Names);
    if (!bVar1) {
      local_80._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Names);
      pbVar3 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_80);
      std::__cxx11::string::string((string *)local_78,(string *)pbVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar4);
      if (!bVar1) {
        pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::operator=((string *)local_78,pcVar4);
        std::__cxx11::string::operator+=((string *)local_78,"/");
        local_88._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Names);
        pbVar3 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        std::__cxx11::string::operator+=((string *)local_78,(string *)pbVar3);
      }
      cmsys::SystemTools::CollapseFullPath(&local_a8,(string *)local_78);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      this_01 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      dir.field_2._8_8_ = cmGlobalGenerator::FindMakefile(this_01,(string *)local_78);
      bVar1 = (cmMakefile *)dir.field_2._8_8_ == (cmMakefile *)0x0;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_c8,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,(allocator *)((long)&name + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&name + 7));
        this_local._7_1_ = 0;
      }
      name._0_4_ = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_78);
      if ((uint)name != 0) goto LAB_004ecac7;
    }
    value = (char *)std::__cxx11::string::c_str();
    local_e0 = (char *)std::__cxx11::string::c_str();
    this_00 = dir.field_2._8_8_;
    pcVar4 = value;
    if ((this->Remove & 1U) != 0) {
      local_e0 = (char *)0x0;
    }
    if ((this->AppendMode & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,pcVar4,&local_129);
      cmMakefile::SetProperty((cmMakefile *)this_00,&local_128,local_e0);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_100,pcVar4,&local_101);
      if (local_e0 == (char *)0x0) {
        local_198 = "";
      }
      else {
        local_198 = local_e0;
      }
      cmMakefile::AppendProperty
                ((cmMakefile *)this_00,&local_100,local_198,(bool)(this->AppendAsString & 1));
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"allows at most one name for DIRECTORY scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local._7_1_ = 0;
  }
LAB_004ecac7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSetPropertyCommand::HandleDirectoryMode()
{
  if(this->Names.size() > 1)
    {
    this->SetError("allows at most one name for DIRECTORY scope.");
    return false;
    }

  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if(!this->Names.empty())
    {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = *this->Names.begin();
    if(!cmSystemTools::FileIsFullPath(dir.c_str()))
      {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += *this->Names.begin();
      }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    mf = this->Makefile->GetGlobalGenerator()->FindMakefile(dir);
    if (!mf)
      {
      // Could not find the directory.
      this->SetError
        ("DIRECTORY scope provided but requested directory was not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    }

  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    mf->AppendProperty(name, value ? value : "", this->AppendAsString);
    }
  else
    {
    mf->SetProperty(name, value);
    }

  return true;
}